

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O3

void crnlib::MatchFinder_CheckLimits(CMatchFinder *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  CLzRef *pCVar3;
  uint uVar4;
  UInt32 UVar5;
  uint uVar6;
  uint uVar7;
  UInt32 lenLimit;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  CLzRef CVar11;
  
  UVar5 = p->pos;
  if (UVar5 == 0xffffffff) {
    uVar4 = -p->historySize - 2 & 0xfffffc00;
    uVar7 = p->numSons + p->hashSizeSum;
    if (uVar7 == 0) {
      UVar5 = 0xffffffff;
    }
    else {
      pCVar3 = p->hash;
      uVar10 = 0;
      do {
        uVar6 = pCVar3[uVar10];
        CVar11 = uVar6 - uVar4;
        if (uVar6 < uVar4) {
          CVar11 = 0;
        }
        pCVar3[uVar10] = CVar11;
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
      UVar5 = p->pos;
    }
    UVar5 = UVar5 - uVar4;
    p->pos = UVar5;
    uVar1 = p->posLimit;
    uVar2 = p->streamPos;
    p->posLimit = uVar1 - uVar4;
    p->streamPos = uVar2 - uVar4;
  }
  if (p->streamEndWasReached == 0) {
    uVar4 = p->keepSizeAfter;
    if (uVar4 == p->streamPos - UVar5) {
      if (p->bufferBase + ((ulong)p->blockSize - (long)p->buffer) <= (Byte *)(ulong)uVar4) {
        memmove(p->bufferBase,p->buffer + -(ulong)p->keepSizeBefore,
                (ulong)(p->keepSizeBefore + uVar4));
        p->buffer = p->bufferBase + p->keepSizeBefore;
      }
      MatchFinder_ReadBlock(p);
    }
  }
  UVar5 = p->cyclicBufferPos;
  if (UVar5 == p->cyclicBufferSize) {
    p->cyclicBufferPos = 0;
    UVar5 = 0;
  }
  uVar4 = p->pos;
  uVar7 = p->cyclicBufferSize - UVar5;
  if (~uVar4 <= uVar7) {
    uVar7 = ~uVar4;
  }
  uVar8 = p->streamPos - uVar4;
  uVar9 = uVar8 - p->keepSizeAfter;
  uVar6 = (uint)(uVar8 != 0);
  if (p->keepSizeAfter <= uVar8 && uVar9 != 0) {
    uVar6 = uVar9;
  }
  if (uVar7 <= uVar6) {
    uVar6 = uVar7;
  }
  if (p->matchMaxLen <= uVar8) {
    uVar8 = p->matchMaxLen;
  }
  p->lenLimit = uVar8;
  p->posLimit = uVar6 + uVar4;
  return;
}

Assistant:

static void MatchFinder_CheckLimits(CMatchFinder* p) {
  if (p->pos == kMaxValForNormalize)
    MatchFinder_Normalize(p);
  if (!p->streamEndWasReached && p->keepSizeAfter == p->streamPos - p->pos)
    MatchFinder_CheckAndMoveAndRead(p);
  if (p->cyclicBufferPos == p->cyclicBufferSize)
    p->cyclicBufferPos = 0;
  MatchFinder_SetLimits(p);
}